

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<7ul>
          (StringBuilder<Memory::ArenaAllocator> *this,char16 (*str) [7])

{
  char16 (*str_local) [7];
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  Append(this,*str,6);
  return;
}

Assistant:

void AppendCppLiteral(const char16(&str)[N])
        {
            // Need to account for the terminating null character in C++ string literals, hence N > 2 and N - 1 below
            static_assert(N > 2, "Use Append(char16) for appending literal single characters and do not append empty string literal");
            Append(str, N - 1);
        }